

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_getbits.c
# Opt level: O1

int main(void)

{
  long in_FS_OFFSET;
  lrtr_ip_addr addr;
  char buf [16];
  lrtr_ip_addr addr_1;
  lrtr_ip_addr local_88 [2];
  lrtr_ip_addr local_58;
  lrtr_ip_addr local_38;
  undefined8 local_20;
  
  local_20 = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_88[0]._0_8_ = 0xaabbcc2200000000;
  lrtr_ip_addr_get_bits(&local_38,local_88,'\0',' ');
  if (local_38.u.addr6.addr[0] == 0xaabbcc22) {
    lrtr_ip_addr_get_bits(&local_58,local_88,'\0','\x01');
    local_38.u.addr6.addr[3] = local_58.u.addr6.addr[3];
    local_38._0_8_ = local_58._0_8_;
    local_38.u._4_8_ = local_58.u._4_8_;
    __assert_fail("result.u.addr4.addr == 0x80000000",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_getbits.c"
                  ,0x18,"void get_bits_testv4(void)");
  }
  __assert_fail("result.u.addr4.addr == 0xAABBCC22",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_getbits.c"
                ,0x15,"void get_bits_testv4(void)");
}

Assistant:

int main(void)
{
	get_bits_testv4();
	get_bits_testv6();
	printf("Test successful\n");
	return EXIT_SUCCESS;
}